

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Impl::requireStructSize
          (Impl *this,uint64_t id,uint dataWordCount,uint pointerCount)

{
  HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize> *this_00;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> **ppRVar1;
  ushort uVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> *pRVar5;
  long lVar6;
  Maybe<capnp::_::RawSchema_*&> MVar7;
  size_t sVar8;
  ushort uVar9;
  Maybe<unsigned_long> MVar10;
  ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry> table;
  uint64_t local_48;
  uint64_t local_40;
  ushort uStack_38;
  ushort uStack_36;
  undefined4 uStack_34;
  HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
  local_30 [8];
  long local_28;
  
  uStack_38 = (ushort)dataWordCount;
  uStack_36 = (ushort)pointerCount;
  pEVar3 = (this->structSizeRequirements).table.rows.builder.ptr;
  sVar8 = (long)(this->structSizeRequirements).table.rows.builder.pos - (long)pEVar3 >> 4;
  table.size_ = (size_t)pEVar3;
  table.ptr = (Entry *)&(this->structSizeRequirements).table.indexes;
  local_48 = id;
  local_40 = id;
  MVar10 = kj::
           HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
           ::
           insert<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long&>
                     (local_30,table,sVar8,(unsigned_long *)sVar8);
  lVar6 = MVar10.ptr._0_8_;
  if (local_30[0] ==
      (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)0x1)
  {
    lVar6 = local_28;
  }
  this_00 = &this->structSizeRequirements;
  if (local_30[0] ==
      (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)0x0)
  {
    pEVar3 = (this->structSizeRequirements).table.rows.builder.endPtr;
    if ((this->structSizeRequirements).table.rows.builder.pos == pEVar3) {
      pEVar4 = (this_00->table).rows.builder.ptr;
      sVar8 = 4;
      if (pEVar3 != pEVar4) {
        sVar8 = (long)pEVar3 - (long)pEVar4 >> 3;
      }
      kj::Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>::
      setCapacity((Vector<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                   *)this_00,sVar8);
    }
    pRVar5 = (this->structSizeRequirements).table.rows.builder.pos;
    pRVar5->key = local_40;
    *(ulong *)&pRVar5->value = CONCAT44(uStack_34,CONCAT22(uStack_36,uStack_38));
    ppRVar1 = &(this->structSizeRequirements).table.rows.builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  else {
    pEVar3 = (this_00->table).rows.builder.ptr;
    uVar2 = pEVar3[lVar6].value.dataWordCount;
    uVar9 = uStack_38;
    if (uStack_38 < uVar2) {
      uVar9 = uVar2;
    }
    pEVar3[lVar6].value.dataWordCount = uVar9;
    uVar2 = pEVar3[lVar6].value.pointerCount;
    uVar9 = uStack_36;
    if (uStack_36 < uVar2) {
      uVar9 = uVar2;
    }
    pEVar3[lVar6].value.pointerCount = uVar9;
  }
  MVar7 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->schemas,&local_48);
  if (MVar7.ptr != (RawSchema **)0x0) {
    applyStructSizeRequirement(this,*MVar7.ptr,dataWordCount,pointerCount);
  }
  return;
}

Assistant:

void SchemaLoader::Impl::requireStructSize(uint64_t id, uint dataWordCount, uint pointerCount) {
  structSizeRequirements.upsert(id, { uint16_t(dataWordCount), uint16_t(pointerCount) },
      [&](RequiredSize& existingValue, RequiredSize&& newValue) {
    existingValue.dataWordCount = kj::max(existingValue.dataWordCount, newValue.dataWordCount);
    existingValue.pointerCount = kj::max(existingValue.pointerCount, newValue.pointerCount);
  });

  KJ_IF_MAYBE(schema, schemas.find(id)) {
    applyStructSizeRequirement(*schema, dataWordCount, pointerCount);
  }
}